

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

void ucnv_extContinueMatchToU_63
               (UConverter *cnv,UConverterToUnicodeArgs *pArgs,int32_t srcIndex,
               UErrorCode *pErrorCode)

{
  int8_t sisoState;
  int32_t iVar1;
  int iVar2;
  int local_44;
  char *pcStack_40;
  int32_t j;
  char *s;
  int32_t length;
  int32_t match;
  uint32_t value;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pUStack_18;
  int32_t srcIndex_local;
  UConverterToUnicodeArgs *pArgs_local;
  UConverter *cnv_local;
  
  length = 0;
  if ((cnv->sharedData->mbcs).outputType == '\f') {
    sisoState = (int8_t)cnv->mode;
  }
  else {
    sisoState = -1;
    if ((cnv->sharedData->mbcs).outputType == 0xdb) {
      sisoState = '\x01';
    }
  }
  _match = pErrorCode;
  pErrorCode_local._4_4_ = srcIndex;
  pUStack_18 = pArgs;
  pArgs_local = (UConverterToUnicodeArgs *)cnv;
  iVar1 = ucnv_extMatchToU((cnv->sharedData->mbcs).extIndexes,sisoState,cnv->preToU,
                           (int)cnv->preToULength,pArgs->source,
                           (int)pArgs->sourceLimit - (int)pArgs->source,(uint32_t *)&length,
                           cnv->useFallback,pArgs->flush);
  if (iVar1 < 1) {
    if (iVar1 < 0) {
      pcStack_40 = pUStack_18->source;
      for (local_44 = (int)pArgs_local[5].flush; local_44 < -iVar1; local_44 = local_44 + 1) {
        *(char *)((long)&pArgs_local[4].sourceLimit + (long)local_44 + 2) = *pcStack_40;
        pcStack_40 = pcStack_40 + 1;
      }
      pUStack_18->source = pcStack_40;
      pArgs_local[5].flush = (UBool)-iVar1;
    }
    else {
      memcpy((void *)((long)&pArgs_local[1].converter + 1),
             (void *)((long)&pArgs_local[4].sourceLimit + 2),(long)(char)pArgs_local[5].field_0x3);
      *(undefined1 *)&pArgs_local[1].converter = pArgs_local[5].field_0x3;
      iVar2 = (int)pArgs_local[5].flush - (int)(char)pArgs_local[5].field_0x3;
      if (0 < iVar2) {
        memmove((void *)((long)&pArgs_local[4].sourceLimit + 2),
                (void *)((long)&pArgs_local[4].sourceLimit +
                        (long)(int)(char)pArgs_local[5].field_0x3 + 2),(long)iVar2);
      }
      pArgs_local[5].flush = -(char)iVar2;
      *_match = U_INVALID_CHAR_FOUND;
    }
  }
  else {
    if (iVar1 < pArgs_local[5].flush) {
      iVar2 = pArgs_local[5].flush - iVar1;
      memmove((void *)((long)&pArgs_local[4].sourceLimit + 2),
              (void *)((long)&pArgs_local[4].sourceLimit + (long)iVar1 + 2),(long)iVar2);
      pArgs_local[5].flush = -(char)iVar2;
    }
    else {
      pUStack_18->source = pUStack_18->source + (iVar1 - pArgs_local[5].flush);
      pArgs_local[5].flush = '\0';
    }
    ucnv_extWriteToU((UConverter *)pArgs_local,*(int32_t **)(pArgs_local->offsets + 0x48),length,
                     &pUStack_18->target,pUStack_18->targetLimit,&pUStack_18->offsets,
                     pErrorCode_local._4_4_,_match);
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extContinueMatchToU(UConverter *cnv,
                         UConverterToUnicodeArgs *pArgs, int32_t srcIndex,
                         UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match, length;

    match=ucnv_extMatchToU(cnv->sharedData->mbcs.extIndexes, (int8_t)UCNV_SISO_STATE(cnv),
                           cnv->preToU, cnv->preToULength,
                           pArgs->source, (int32_t)(pArgs->sourceLimit-pArgs->source),
                           &value,
                           cnv->useFallback, pArgs->flush);
    if(match>0) {
        if(match>=cnv->preToULength) {
            /* advance src pointer for the consumed input */
            pArgs->source+=match-cnv->preToULength;
            cnv->preToULength=0;
        } else {
            /* the match did not use all of preToU[] - keep the rest for replay */
            length=cnv->preToULength-match;
            uprv_memmove(cnv->preToU, cnv->preToU+match, length);
            cnv->preToULength=(int8_t)-length;
        }

        /* write result */
        ucnv_extWriteToU(cnv, cnv->sharedData->mbcs.extIndexes,
                         value,
                         &pArgs->target, pArgs->targetLimit,
                         &pArgs->offsets, srcIndex,
                         pErrorCode);
    } else if(match<0) {
        /* save state for partial match */
        const char *s;
        int32_t j;

        /* just _append_ the newly consumed input to preToU[] */
        s=pArgs->source;
        match=-match;
        for(j=cnv->preToULength; j<match; ++j) {
            cnv->preToU[j]=*s++;
        }
        pArgs->source=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preToULength=(int8_t)match;
    } else /* match==0 */ {
        /*
         * no match
         *
         * We need to split the previous input into two parts:
         *
         * 1. The first codepage character is unmappable - that's how we got into
         *    trying the extension data in the first place.
         *    We need to move it from the preToU buffer
         *    to the error buffer, set an error code,
         *    and prepare the rest of the previous input for 2.
         *
         * 2. The rest of the previous input must be converted once we
         *    come back from the callback for the first character.
         *    At that time, we have to try again from scratch to convert
         *    these input characters.
         *    The replay will be handled by the ucnv.c conversion code.
         */

        /* move the first codepage character to the error field */
        uprv_memcpy(cnv->toUBytes, cnv->preToU, cnv->preToUFirstLength);
        cnv->toULength=cnv->preToUFirstLength;

        /* move the rest up inside the buffer */
        length=cnv->preToULength-cnv->preToUFirstLength;
        if(length>0) {
            uprv_memmove(cnv->preToU, cnv->preToU+cnv->preToUFirstLength, length);
        }

        /* mark preToU for replay */
        cnv->preToULength=(int8_t)-length;

        /* set the error code for unassigned */
        *pErrorCode=U_INVALID_CHAR_FOUND;
    }
}